

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv.cpp
# Opt level: O2

int32_t find_root_descriptor_index
                  (Remapper *remapper,dxil_spv_d3d_binding *binding,
                  dxil_spv_resource_class resource_class)

{
  RootDescriptor *pRVar1;
  RootDescriptor *pRVar2;
  bool bVar3;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  __it;
  long lVar4;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  _Var5;
  long lVar6;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_spirv_cpp:304:26)>
  local_50;
  dxil_spv_resource_class resource_class_local;
  dxil_spv_d3d_binding *binding_local;
  
  local_50._M_pred.binding = &binding_local;
  local_50._M_pred.resource_class = &resource_class_local;
  pRVar1 = (remapper->root_descriptors).
           super__Vector_base<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (remapper->root_descriptors).
           super__Vector_base<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pRVar2 - (long)pRVar1;
  __it._M_current = pRVar1;
  resource_class_local = resource_class;
  binding_local = binding;
  for (lVar4 = lVar6 / 0xc >> 2; _Var5._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1)
  {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
            ::operator()(&local_50,__it);
    if (bVar3) goto LAB_0012c692;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
            ::operator()(&local_50,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0012c692;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
            ::operator()(&local_50,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0012c692;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
            ::operator()(&local_50,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0012c692;
    __it._M_current = __it._M_current + 4;
    lVar6 = lVar6 + -0x30;
  }
  lVar6 = lVar6 / 0xc;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return -1;
      }
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
              ::operator()(&local_50,__it);
      if (bVar3) goto LAB_0012c692;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
            ::operator()(&local_50,__it);
    _Var5._M_current = __it._M_current;
    if (bVar3) goto LAB_0012c692;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::$_0>
          ::operator()(&local_50,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar3) {
    _Var5._M_current = pRVar2;
  }
LAB_0012c692:
  if (_Var5._M_current == pRVar2) {
    return -1;
  }
  return (int32_t)(((long)_Var5._M_current - (long)pRVar1) / 0xc);
}

Assistant:

static int32_t find_root_descriptor_index(const Remapper *remapper, const dxil_spv_d3d_binding *binding,
                                          dxil_spv_resource_class resource_class)
{
	auto itr = std::find_if(remapper->root_descriptors.begin(), remapper->root_descriptors.end(),
	                        [&](const Remapper::RootDescriptor &desc)
	                        {
	                          return desc.resource_class == resource_class &&
	                                 desc.space == binding->register_space &&
	                                 desc.register_index == binding->register_index;
	                        });

	if (itr != remapper->root_descriptors.end())
		return int32_t(itr - remapper->root_descriptors.begin());
	else
		return -1;
}